

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8272.cpp
# Opt level: O0

void __thiscall Intel::i8272::i8272::run_for(i8272 *this,Cycles cycles)

{
  IntType IVar1;
  Drive *pDVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  byte local_81;
  int head;
  int drive;
  int c_1;
  int timers_left;
  LogLine local_40;
  int local_34;
  long lStack_30;
  int direction;
  IntType steps;
  int c;
  int drives_left;
  i8272 *local_18;
  i8272 *this_local;
  Cycles cycles_local;
  
  _c = cycles.super_WrappedInt<Cycles>.length_;
  local_18 = this;
  this_local = (i8272 *)cycles.super_WrappedInt<Cycles>.length_;
  Storage::Disk::Controller::run_for((Controller *)this,cycles);
  if ((this->is_sleeping_ & 1U) == 0) {
    if (0 < this->delay_time_) {
      IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
      if (IVar1 < this->delay_time_) {
        IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
        this->delay_time_ = this->delay_time_ - IVar1;
      }
      else {
        this->delay_time_ = 0;
        posit_event(this,0x10);
      }
    }
    if (this->drives_seeking_ != 0) {
      steps._4_4_ = this->drives_seeking_;
      for (steps._0_4_ = 0; (int)(uint)steps < 4; steps._0_4_ = (uint)steps + 1) {
        if (this->drives_[(int)(uint)steps].phase == Seeking) {
          IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
          this->drives_[(int)(uint)steps].step_rate_counter =
               IVar1 + this->drives_[(int)(uint)steps].step_rate_counter;
          lStack_30 = this->drives_[(int)(uint)steps].step_rate_counter /
                      (long)(this->step_rate_time_ * 8000);
          this->drives_[(int)(uint)steps].step_rate_counter =
               this->drives_[(int)(uint)steps].step_rate_counter %
               (long)(this->step_rate_time_ * 8000);
          do {
            lVar5 = lStack_30 + -1;
            bVar6 = lStack_30 == 0;
            lStack_30 = lVar5;
            if (bVar6) goto LAB_00220ac3;
            bVar6 = (int)(uint)this->drives_[(int)(uint)steps].head_position <=
                    this->drives_[(int)(uint)steps].target_head_position;
            local_34 = (bVar6 - 1) + (uint)bVar6;
            Log::Logger<(Log::Source)13>::info((Logger<(Log::Source)13> *)&local_40);
            Log::Logger<(Log::Source)13>::LogLine::append
                      (&local_40,"Target %d versus believed %d",
                       (ulong)(uint)this->drives_[(int)(uint)steps].target_head_position,
                       (ulong)this->drives_[(int)(uint)steps].head_position);
            Log::Logger<(Log::Source)13>::LogLine::~LogLine(&local_40);
            (*(this->super_MFMController).super_Controller.super_Source._vptr_Source[8])
                      (this,(ulong)(uint)steps);
            pDVar2 = Storage::Disk::Controller::get_drive((Controller *)this);
            Storage::Disk::HeadPosition::HeadPosition((HeadPosition *)&c_1,local_34);
            Storage::Disk::Drive::step(pDVar2,(HeadPosition)c_1);
            if (-1 < this->drives_[(int)(uint)steps].target_head_position) {
              this->drives_[(int)(uint)steps].head_position =
                   this->drives_[(int)(uint)steps].head_position + (char)local_34;
            }
            bVar6 = seek_is_satisfied(this,(uint)steps);
          } while (!bVar6);
          this->drives_[(int)(uint)steps].phase = CompletedSeeking;
          this->drives_seeking_ = this->drives_seeking_ + -1;
LAB_00220ac3:
          steps._4_4_ = steps._4_4_ + -1;
          if (steps._4_4_ == 0) break;
        }
      }
    }
    if (this->head_timers_running_ != 0) {
      drive = this->head_timers_running_;
      for (head = 0; head < 8; head = head + 1) {
        iVar3 = head >> 1;
        uVar4 = head & 1;
        if (0 < this->drives_[iVar3].head_unload_delay[(int)uVar4]) {
          IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
          if (IVar1 < this->drives_[iVar3].head_unload_delay[(int)uVar4]) {
            IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
            this->drives_[iVar3].head_unload_delay[(int)uVar4] =
                 this->drives_[iVar3].head_unload_delay[(int)uVar4] - IVar1;
          }
          else {
            this->drives_[iVar3].head_unload_delay[(int)uVar4] = 0;
            this->drives_[iVar3].head_is_loaded[(int)uVar4] = false;
            this->head_timers_running_ = this->head_timers_running_ + -1;
          }
          drive = drive + -1;
          if (drive == 0) break;
        }
      }
    }
    if ((this->is_executing_ & 1U) != 0) {
      pDVar2 = Storage::Disk::Controller::get_drive((Controller *)this);
      bVar6 = Storage::Disk::Drive::get_is_ready(pDVar2);
      if (!bVar6) {
        posit_event(this,0x40);
      }
    }
    local_81 = 0;
    if ((this->delay_time_ == 0) && (local_81 = 0, this->drives_seeking_ == 0)) {
      local_81 = this->head_timers_running_ != 0 ^ 0xff;
    }
    this->is_sleeping_ = (bool)(local_81 & 1);
    if ((this->is_sleeping_ & 1U) != 0) {
      ClockingHint::Source::update_clocking_observer((Source *)this);
    }
  }
  return;
}

Assistant:

void i8272::run_for(Cycles cycles) {
	Storage::Disk::MFMController::run_for(cycles);

	if(is_sleeping_) return;

	// check for an expired timer
	if(delay_time_ > 0) {
		if(cycles.as_integral() >= delay_time_) {
			delay_time_ = 0;
			posit_event(int(Event8272::Timer));
		} else {
			delay_time_ -= cycles.as_integral();
		}
	}

	// update seek status of any drives presently seeking
	if(drives_seeking_) {
		int drives_left = drives_seeking_;
		for(int c = 0; c < 4; c++) {
			if(drives_[c].phase == Drive::Seeking) {
				drives_[c].step_rate_counter += cycles.as_integral();
				auto steps = drives_[c].step_rate_counter / (8000 * step_rate_time_);
				drives_[c].step_rate_counter %= (8000 * step_rate_time_);
				while(steps--) {
					// Perform a step.
					int direction = (drives_[c].target_head_position < drives_[c].head_position) ? -1 : 1;
					logger.info().append("Target %d versus believed %d", drives_[c].target_head_position, drives_[c].head_position);
					select_drive(c);
					get_drive().step(Storage::Disk::HeadPosition(direction));
					if(drives_[c].target_head_position >= 0) drives_[c].head_position += direction;

					// Check for completion.
					if(seek_is_satisfied(c)) {
						drives_[c].phase = Drive::CompletedSeeking;
						drives_seeking_--;
						break;
					}
				}

				drives_left--;
				if(!drives_left) break;
			}
		}
	}

	// check for any head unloads
	if(head_timers_running_) {
		int timers_left = head_timers_running_;
		for(int c = 0; c < 8; c++) {
			int drive = (c >> 1);
			int head = c&1;

			if(drives_[drive].head_unload_delay[head] > 0) {
				if(cycles.as_integral() >= drives_[drive].head_unload_delay[head]) {
					drives_[drive].head_unload_delay[head] = 0;
					drives_[drive].head_is_loaded[head] = false;
					head_timers_running_--;
				} else {
					drives_[drive].head_unload_delay[head] -= cycles.as_integral();
				}
				timers_left--;
				if(!timers_left) break;
			}
		}
	}

	// check for busy plus ready disabled
	if(is_executing_ && !get_drive().get_is_ready()) {
		posit_event(int(Event8272::NoLongerReady));
	}

	is_sleeping_ = !delay_time_ && !drives_seeking_ && !head_timers_running_;
	if(is_sleeping_) update_clocking_observer();
}